

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O2

void Prs_ManVecFree(Vec_Ptr_t *vPrs)

{
  void *__ptr;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < vPrs->nSize; i_00 = i_00 + 1) {
    __ptr = Vec_PtrEntry(vPrs,i_00);
    if (*(Abc_Nam_t **)((long)__ptr + 8) != (Abc_Nam_t *)0x0) {
      Abc_NamDeref(*(Abc_Nam_t **)((long)__ptr + 8));
    }
    if (*(Abc_Nam_t **)((long)__ptr + 0x10) != (Abc_Nam_t *)0x0) {
      Abc_NamDeref(*(Abc_Nam_t **)((long)__ptr + 0x10));
    }
    if (*(Hash_IntMan_t **)((long)__ptr + 0x18) != (Hash_IntMan_t *)0x0) {
      Hash_IntManDeref(*(Hash_IntMan_t **)((long)__ptr + 0x18));
    }
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x20));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x30));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x40));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x50));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x60));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x70));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x80));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x90));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xa0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xb0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xc0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xd0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xe0));
    free(__ptr);
  }
  Vec_PtrFree(vPrs);
  return;
}

Assistant:

static inline void Prs_ManVecFree( Vec_Ptr_t * vPrs )
{
    Prs_Ntk_t * pNtk; int i;
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_NtkFree( pNtk );
    Vec_PtrFree( vPrs );
}